

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O2

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte bVar2;
  uInt uVar3;
  uint uVar4;
  internal_state *piVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulg uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  byte *pbVar18;
  uint uVar19;
  byte *pbVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  byte *pbVar24;
  uint uVar25;
  byte *pbVar26;
  ulong uVar27;
  int local_48;
  
  piVar5 = strm->state;
  pbVar18 = strm->next_in;
  pbVar20 = pbVar18 + (strm->avail_in - 5);
  pbVar6 = strm->next_out;
  uVar3 = strm->avail_out;
  local_48 = (int)pbVar6 - (start - uVar3);
  iVar15 = *(int *)((long)&piVar5->gzhead + 4);
  uVar10 = piVar5->gzindex;
  uVar4 = *(uint *)((long)&piVar5->gzindex + 4);
  uVar11 = piVar5->crc0[10];
  lVar7 = *(long *)&piVar5->method;
  uVar27 = *(ulong *)piVar5->crc0;
  uVar12 = piVar5->crc0[0xb];
  uVar13 = piVar5->crc0[2];
  lVar8 = *(long *)(piVar5->crc0 + 6);
  lVar9 = *(long *)(piVar5->crc0 + 8);
  pbVar24 = pbVar6;
LAB_0010beb0:
  if (uVar13 < 0xf) {
    bVar2 = *pbVar18;
    pbVar26 = pbVar18 + 1;
    pbVar18 = pbVar18 + 2;
    uVar27 = ((ulong)*pbVar26 << ((byte)uVar13 + 8 & 0x3f)) +
             ((ulong)bVar2 << ((byte)uVar13 & 0x3f)) + uVar27;
    uVar13 = uVar13 | 0x10;
  }
  pbVar26 = (byte *)(lVar8 + (ulong)((uint)uVar27 & ~(-1 << ((byte)uVar11 & 0x1f))) * 4);
  while( true ) {
    uVar27 = uVar27 >> (pbVar26[1] & 0x3f);
    uVar13 = uVar13 - pbVar26[1];
    bVar2 = *pbVar26;
    if (bVar2 == 0) break;
    if ((bVar2 & 0x10) != 0) {
      uVar25 = (uint)*(ushort *)(pbVar26 + 2);
      uVar17 = bVar2 & 0xf;
      if ((bVar2 & 0xf) != 0) {
        if (uVar13 < uVar17) {
          bVar2 = *pbVar18;
          pbVar18 = pbVar18 + 1;
          uVar27 = uVar27 + ((ulong)bVar2 << ((byte)uVar13 & 0x3f));
          uVar13 = uVar13 + 8;
        }
        uVar25 = (uint)*(ushort *)(pbVar26 + 2) + (~(-1 << (sbyte)uVar17) & (uint)uVar27);
        uVar27 = uVar27 >> (sbyte)uVar17;
        uVar13 = uVar13 - uVar17;
      }
      if (uVar13 < 0xf) {
        bVar2 = *pbVar18;
        pbVar26 = pbVar18 + 1;
        pbVar18 = pbVar18 + 2;
        uVar27 = ((ulong)*pbVar26 << ((byte)uVar13 + 8 & 0x3f)) +
                 ((ulong)bVar2 << ((byte)uVar13 & 0x3f)) + uVar27;
        uVar13 = uVar13 | 0x10;
      }
      pbVar26 = (byte *)((ulong)((uint)uVar27 & ~(-1 << ((byte)uVar12 & 0x1f))) * 4 + lVar9);
      goto LAB_0010bfa6;
    }
    if ((bVar2 & 0x40) != 0) {
      iVar15 = 0x3f3f;
      if ((bVar2 & 0x20) != 0) goto LAB_0010c29f;
      pcVar16 = "invalid literal/length code";
      goto LAB_0010c296;
    }
    pbVar26 = (byte *)(lVar8 + (ulong)*(ushort *)(pbVar26 + 2) * 4 +
                      (ulong)(~(-1 << (bVar2 & 0x1f)) & (uint)uVar27) * 4);
  }
  *pbVar24 = pbVar26[2];
  pbVar26 = pbVar24 + 1;
  goto LAB_0010c253;
LAB_0010bfa6:
  uVar27 = uVar27 >> (pbVar26[1] & 0x3f);
  uVar13 = uVar13 - pbVar26[1];
  bVar2 = *pbVar26;
  if ((bVar2 & 0x10) != 0) goto LAB_0010bfe9;
  if ((bVar2 & 0x40) != 0) {
    pcVar16 = "invalid distance code";
    goto LAB_0010c296;
  }
  pbVar26 = (byte *)((ulong)*(ushort *)(pbVar26 + 2) * 4 + lVar9 +
                    (ulong)(~(-1 << (bVar2 & 0x1f)) & (uint)uVar27) * 4);
  goto LAB_0010bfa6;
LAB_0010bfe9:
  uVar17 = bVar2 & 0xf;
  if (uVar13 < uVar17) {
    uVar27 = ((ulong)*pbVar18 << ((byte)uVar13 & 0x3f)) + uVar27;
    uVar14 = uVar13 + 8;
    if (uVar14 < uVar17) {
      pbVar1 = pbVar18 + 1;
      pbVar18 = pbVar18 + 2;
      uVar27 = uVar27 + ((ulong)*pbVar1 << ((byte)uVar14 & 0x3f));
      uVar13 = uVar13 + 0x10;
    }
    else {
      pbVar18 = pbVar18 + 1;
      uVar13 = uVar14;
    }
  }
  uVar14 = (~(-1 << (sbyte)uVar17) & (uint)uVar27) + (uint)*(ushort *)(pbVar26 + 2);
  uVar27 = uVar27 >> (sbyte)uVar17;
  uVar13 = uVar13 - uVar17;
  uVar17 = (int)pbVar24 - local_48;
  uVar23 = (ulong)uVar14;
  uVar19 = uVar14 - uVar17;
  if (uVar14 < uVar17 || uVar19 == 0) {
    lVar22 = 0;
    uVar17 = uVar25;
    do {
      lVar21 = lVar22;
      pbVar24[lVar21] = pbVar24[lVar21 - uVar23];
      pbVar24[lVar21 + 1] = pbVar24[lVar21 + (1 - uVar23)];
      pbVar24[lVar21 + 2] = pbVar24[lVar21 + (2 - uVar23)];
      uVar17 = uVar17 - 3;
      lVar22 = lVar21 + 3;
    } while (2 < uVar17);
    if ((uint)lVar22 == uVar25) {
      pbVar26 = pbVar24 + lVar22;
    }
    else {
      pbVar24[lVar22] = pbVar24[lVar22 + -uVar23];
      if ((uint)lVar22 - uVar25 == -2) {
        pbVar26 = pbVar24 + lVar21 + 5;
        pbVar24[lVar21 + 4] = pbVar24[-uVar23 + 1 + lVar22];
      }
      else {
        pbVar26 = pbVar24 + lVar21 + 4;
      }
    }
    goto LAB_0010c253;
  }
  if (((uint)uVar10 < uVar19) && (piVar5[1].d_desc.max_code != 0)) {
    pcVar16 = "invalid distance too far back";
LAB_0010c296:
    strm->msg = pcVar16;
    iVar15 = 0x3f51;
LAB_0010c29f:
    piVar5->status = iVar15;
    pbVar26 = pbVar24;
LAB_0010c2a3:
    strm->next_in = pbVar18 + -(ulong)(uVar13 >> 3);
    strm->next_out = pbVar26;
    strm->avail_in = ((int)pbVar20 - (int)(pbVar18 + -(ulong)(uVar13 >> 3))) + 5;
    strm->avail_out = ((int)(pbVar6 + (uVar3 - 0x101)) - (int)pbVar26) + 0x101;
    *(ulong *)piVar5->crc0 = (ulong)((uint)uVar27 & ~(-1 << (sbyte)(uVar13 & 7)));
    piVar5->crc0[2] = uVar13 & 7;
    return;
  }
  if (uVar4 == 0) {
    lVar22 = (ulong)(iVar15 - uVar19) + lVar7;
    uVar17 = uVar25 - uVar19;
    if (uVar19 <= uVar25 && uVar17 != 0) {
      lVar21 = 0;
      do {
        *pbVar24 = *(byte *)(lVar22 + lVar21);
        pbVar24 = pbVar24 + 1;
        lVar21 = lVar21 + 1;
      } while (uVar19 != (uint)lVar21);
LAB_0010c1bf:
      lVar22 = (long)pbVar24 - uVar23;
      uVar25 = uVar17;
    }
  }
  else if (uVar4 < uVar19) {
    lVar22 = (ulong)((uVar4 + iVar15) - uVar19) + lVar7;
    uVar19 = uVar19 - uVar4;
    uVar17 = uVar25 - uVar19;
    if (uVar19 <= uVar25 && uVar17 != 0) {
      lVar21 = 0;
      do {
        pbVar24[lVar21] = *(byte *)(lVar22 + lVar21);
        lVar21 = lVar21 + 1;
      } while (uVar19 != (uint)lVar21);
      pbVar24 = pbVar24 + lVar21;
      lVar22 = lVar7;
      uVar25 = uVar17;
      if (uVar4 < uVar17) {
        lVar22 = 0;
        do {
          *pbVar24 = *(byte *)(lVar7 + lVar22);
          pbVar24 = pbVar24 + 1;
          lVar22 = lVar22 + 1;
        } while (uVar4 != (uint)lVar22);
        uVar17 = uVar17 - uVar4;
        goto LAB_0010c1bf;
      }
    }
  }
  else {
    lVar22 = (ulong)(uVar4 - uVar19) + lVar7;
    uVar17 = uVar25 - uVar19;
    if (uVar19 <= uVar25 && uVar17 != 0) {
      lVar21 = 0;
      do {
        *pbVar24 = *(byte *)(lVar22 + lVar21);
        pbVar24 = pbVar24 + 1;
        lVar21 = lVar21 + 1;
      } while (uVar19 != (uint)lVar21);
      goto LAB_0010c1bf;
    }
  }
  lVar21 = 0;
  for (uVar17 = uVar25; 2 < uVar17; uVar17 = uVar17 - 3) {
    pbVar24[lVar21] = *(byte *)(lVar22 + lVar21);
    pbVar24[lVar21 + 1] = *(byte *)(lVar22 + 1 + lVar21);
    pbVar24[lVar21 + 2] = *(byte *)(lVar22 + 2 + lVar21);
    lVar21 = lVar21 + 3;
  }
  if ((uint)lVar21 == uVar25) {
    pbVar26 = pbVar24 + lVar21;
  }
  else {
    pbVar24[lVar21] = *(byte *)(lVar22 + lVar21);
    if ((uint)lVar21 - uVar25 == -2) {
      pbVar26 = pbVar24 + lVar21 + 2;
      pbVar24[lVar21 + 1] = *(byte *)(lVar22 + 1 + lVar21);
    }
    else {
      pbVar26 = pbVar24 + lVar21 + 1;
    }
  }
LAB_0010c253:
  if ((pbVar20 <= pbVar18) || (pbVar24 = pbVar26, pbVar6 + (uVar3 - 0x101) <= pbVar26))
  goto LAB_0010c2a3;
  goto LAB_0010beb0;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(z_streamp strm, unsigned start) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code const *here;           /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - (INFLATE_FAST_MIN_INPUT - 1));
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - (INFLATE_FAST_MIN_OUTPUT - 1));
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode + (hold & lmask);
      dolen:
        op = (unsigned)(here->bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here->op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here->val >= 0x20 && here->val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here->val));
            *out++ = (unsigned char)(here->val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here->val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode + (hold & dmask);
          dodist:
            op = (unsigned)(here->bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here->op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here->val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode + here->val + (hold & ((1U << op) - 1));
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode + here->val + (hold & ((1U << op) - 1));
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ?
        (INFLATE_FAST_MIN_INPUT - 1) + (last - in) :
        (INFLATE_FAST_MIN_INPUT - 1) - (in - last));
    strm->avail_out = (unsigned)(out < end ?
        (INFLATE_FAST_MIN_OUTPUT - 1) + (end - out) :
        (INFLATE_FAST_MIN_OUTPUT - 1) - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}